

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c++
# Opt level: O0

void __thiscall
capnp::_::ReaderArena::ReaderArena
          (ReaderArena *this,MessageReader *message,word *firstSegment,
          SegmentWordCount firstSegmentSize)

{
  ReaderOptions *pRVar1;
  unsigned_long limit;
  SegmentId local_38 [5];
  SegmentWordCount local_24;
  word *pwStack_20;
  SegmentWordCount firstSegmentSize_local;
  word *firstSegment_local;
  MessageReader *message_local;
  ReaderArena *this_local;
  
  local_24 = firstSegmentSize;
  pwStack_20 = firstSegment;
  firstSegment_local = (word *)message;
  message_local = (MessageReader *)this;
  Arena::Arena(&this->super_Arena);
  (this->super_Arena)._vptr_Arena = (_func_int **)&PTR__ReaderArena_004c6c60;
  this->message = (MessageReader *)firstSegment_local;
  pRVar1 = MessageReader::getOptions((MessageReader *)firstSegment_local);
  limit = bounded<unsigned_long>(pRVar1->traversalLimitInWords);
  ReadLimiter::ReadLimiter(&this->readLimiter,limit);
  kj::Id<unsigned_int,_capnp::_::Segment>::Id(local_38,0);
  SegmentReader::SegmentReader
            (&this->segment0,&this->super_Arena,local_38[0],pwStack_20,local_24,&this->readLimiter);
  kj::
  MutexGuarded<kj::Maybe<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader,_std::nullptr_t>_>_>_>
  ::MutexGuarded<>(&this->moreSegments);
  return;
}

Assistant:

inline ReaderArena::ReaderArena(MessageReader* message, const word* firstSegment,
                                SegmentWordCount firstSegmentSize)
    : message(message),
      readLimiter(bounded(message->getOptions().traversalLimitInWords) * WORDS),
      segment0(this, SegmentId(0), firstSegment, firstSegmentSize, &readLimiter) {}